

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_utils.cc
# Opt level: O0

bool draco::parser::ParseSignedInt(DecoderBuffer *buffer,int32_t *value)

{
  bool bVar1;
  int iVar2;
  DecoderBuffer *in_RSI;
  DecoderBuffer *in_RDI;
  uint32_t v;
  int sign;
  char ch;
  int local_28;
  int local_24;
  undefined4 in_stack_ffffffffffffffe4;
  bool local_1;
  
  bVar1 = DecoderBuffer::Peek<char>(in_RDI,&stack0xffffffffffffffe7);
  if (bVar1) {
    iVar2 = GetSignValue((char)((uint)in_stack_ffffffffffffffe4 >> 0x18));
    if (iVar2 != 0) {
      DecoderBuffer::Advance(in_RDI,1);
    }
    bVar1 = ParseUnsignedInt(in_RSI,(uint32_t *)CONCAT44(in_stack_ffffffffffffffe4,iVar2));
    if (bVar1) {
      if (iVar2 < 0) {
        local_28 = -local_24;
      }
      else {
        local_28 = local_24;
      }
      *(int *)&in_RSI->data_ = local_28;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ParseSignedInt(DecoderBuffer *buffer, int32_t *value) {
  // Parse any explicit sign and set the appropriate largest magnitude
  // value that can be represented without overflow.
  char ch;
  if (!buffer->Peek(&ch)) {
    return false;
  }
  const int sign = GetSignValue(ch);
  if (sign != 0) {
    buffer->Advance(1);
  }

  // Attempt to parse integer body.
  uint32_t v;
  if (!ParseUnsignedInt(buffer, &v)) {
    return false;
  }
  *value = (sign < 0) ? -v : v;
  return true;
}